

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRMath.cpp
# Opt level: O3

istream * MinVR::operator>>(istream *is,VRVector3 *v)

{
  istream *piVar1;
  char dummy;
  char local_11;
  
  piVar1 = std::operator>>(is,&local_11);
  piVar1 = std::istream::_M_extract<float>((float *)piVar1);
  piVar1 = std::operator>>(piVar1,&local_11);
  piVar1 = std::istream::_M_extract<float>((float *)piVar1);
  piVar1 = std::operator>>(piVar1,&local_11);
  piVar1 = std::istream::_M_extract<float>((float *)piVar1);
  piVar1 = std::operator>>(piVar1,&local_11);
  return piVar1;
}

Assistant:

std::istream & operator>> ( std::istream &is, VRVector3 &v) {
  // format:  <x, y, z>
  char dummy;
  return is >> dummy >> v.x >> dummy >> v.y >> dummy >> v.z >> dummy;
}